

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::beginMacro(QUndoStack *this,QString *text)

{
  long lVar1;
  QUndoCommand *this_00;
  value_type pQVar2;
  QList<QUndoCommand_*> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  this_00 = (QUndoCommand *)operator_new(0x10);
  QUndoCommand::QUndoCommand(this_00,(QUndoCommand *)0x0);
  QUndoCommand::setText(this_00,text);
  if (*(long *)(lVar1 + 0xa0) == 0) {
    this_01 = (QList<QUndoCommand_*> *)(lVar1 + 0x78);
    while ((long)*(int *)(lVar1 + 0xa8) < *(long *)(lVar1 + 0x88)) {
      pQVar2 = QList<QUndoCommand_*>::takeLast(this_01);
      if (pQVar2 != (value_type)0x0) {
        (*pQVar2->_vptr_QUndoCommand[1])(pQVar2);
      }
    }
    if (*(int *)(lVar1 + 0xa8) < *(int *)(lVar1 + 0xac)) {
      *(undefined4 *)(lVar1 + 0xac) = 0xffffffff;
    }
  }
  else {
    this_01 = *(QList<QUndoCommand_*> **)
               (*(long *)(*(long *)(lVar1 + 0x98) + -8 + *(long *)(lVar1 + 0xa0) * 8) + 8);
  }
  QList<QUndoCommand_*>::append(this_01,this_00);
  QList<QUndoCommand_*>::append((QList<QUndoCommand_*> *)(lVar1 + 0x90),this_00);
  if (*(long *)(lVar1 + 0xa0) == 1) {
    canUndoChanged(this,false);
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    undoTextChanged(this,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    canRedoChanged(this,false);
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    redoTextChanged(this,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoStack::beginMacro(const QString &text)
{
    Q_D(QUndoStack);
    QUndoCommand *cmd = new QUndoCommand();
    cmd->setText(text);

    if (d->macro_stack.isEmpty()) {
        while (d->index < d->command_list.size())
            delete d->command_list.takeLast();
        if (d->clean_index > d->index)
            d->clean_index = -1; // we've deleted the clean state
        d->command_list.append(cmd);
    } else {
        d->macro_stack.constLast()->d->child_list.append(cmd);
    }
    d->macro_stack.append(cmd);

    if (d->macro_stack.size() == 1) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
    }
}